

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O0

char * rnndec_decodeval(rnndeccontext *ctx,rnntypeinfo *ti,uint64_t value,int width)

{
  int iVar1;
  rnndeccontext *ctx_00;
  ulong uVar2;
  char *__ptr;
  int in_ECX;
  rnntypeinfo *in_RDX;
  rnndeccontext *in_RSI;
  long in_RDI;
  anon_union_8_3_4e90a3e7 val;
  char *subval;
  uint64_t sval;
  uint64_t mask;
  char *tmp;
  int bitfieldsnum;
  rnnbitfield **bitfields;
  int valsnum;
  rnnvalue **vals;
  int i;
  char *res;
  rnnvarinfo *in_stack_ffffffffffffff70;
  float local_80;
  ulong local_68;
  char *local_60;
  int local_54;
  rnndecvariant **local_50;
  int local_44;
  rnndeccolors *local_40;
  int local_34;
  undefined4 in_stack_ffffffffffffffd8;
  char *local_8;
  
  local_8 = (char *)0x0;
  if (in_RSI == (rnndeccontext *)0x0) goto switchD_0010ad3e_default;
  if (*(int *)&in_RSI[2].vars != 0) {
    in_RDX = (rnntypeinfo *)((long)in_RDX << ((byte)*(undefined4 *)&in_RSI[2].vars & 0x3f));
  }
  ctx_00 = (rnndeccontext *)(ulong)*(uint *)&in_RSI->vars;
  switch(ctx_00) {
  case (rnndeccontext *)0x0:
    local_40 = in_RSI[1].colors;
    local_44 = *(int *)&in_RSI[2].db;
    goto LAB_0010ad8a;
  case (rnndeccontext *)0x1:
    local_50 = in_RSI[1].vars;
    local_54 = in_RSI[1].varsnum;
    goto LAB_0010aeab;
  case (rnndeccontext *)0x2:
    local_40 = *(rnndeccolors **)(*(long *)&in_RSI->varsnum + 0x50);
    local_44 = *(int *)(*(long *)&in_RSI->varsnum + 0x58);
LAB_0010ad8a:
    for (local_34 = 0; local_34 < local_44; local_34 = local_34 + 1) {
      iVar1 = rnndec_varmatch(ctx_00,in_stack_ffffffffffffff70);
      if (((iVar1 != 0) && (*(int *)((&local_40->ceval)[local_34] + 8) != 0)) &&
         (*(rnntypeinfo **)((&local_40->ceval)[local_34] + 0x10) == in_RDX)) {
        asprintf((char **)&stack0xffffffffffffffd0,"%s%s%s",**(undefined8 **)(in_RDI + 0x18),
                 *(undefined8 *)(&local_40->ceval)[local_34],
                 *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x28));
        return local_8;
      }
    }
  default:
switchD_0010ad3e_default:
    asprintf((char **)&stack0xffffffffffffffd0,"%s%#lx%s",
             *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x20),in_RDX,
             *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x28));
    break;
  case (rnndeccontext *)0x3:
    local_50 = (rnndecvariant **)in_RSI->colors[1].cerr;
    local_54 = *(int *)&in_RSI->colors[1].cend;
LAB_0010aeab:
    local_68 = 0;
    for (local_34 = 0; local_34 < local_54; local_34 = local_34 + 1) {
      iVar1 = rnndec_varmatch(ctx_00,in_stack_ffffffffffffff70);
      if (iVar1 != 0) {
        uVar2 = ((ulong)in_RDX & (ulong)local_50[local_34][1].en) >>
                ((byte)local_50[local_34]->variant & 0x3f);
        local_68 = (ulong)local_50[local_34][1].en | local_68;
        if (*(int *)&local_50[local_34][6].en == 9) {
          if (uVar2 != 0) {
            if (uVar2 != 1) goto LAB_0010b024;
            if (local_8 == (char *)0x0) {
              asprintf((char **)&stack0xffffffffffffffd0,"%s%s%s",
                       *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x18),local_50[local_34]->en,
                       *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x28));
            }
            else {
              asprintf(&local_60,"%s | %s%s%s",local_8,
                       *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x18),local_50[local_34]->en,
                       *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x28));
              free(local_8);
              local_8 = local_60;
            }
          }
        }
        else {
LAB_0010b024:
          __ptr = rnndec_decodeval(in_RSI,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                   (int)((ulong)local_8 >> 0x20));
          if (local_8 == (char *)0x0) {
            asprintf((char **)&stack0xffffffffffffffd0,"%s%s%s = %s",
                     *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x10),local_50[local_34]->en,
                     *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x28),__ptr);
          }
          else {
            asprintf(&local_60,"%s | %s%s%s = %s",local_8,
                     *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x10),local_50[local_34]->en,
                     *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x28),__ptr);
            free(local_8);
            local_8 = local_60;
          }
          free(__ptr);
        }
      }
    }
    if (((ulong)in_RDX & (local_68 ^ 0xffffffffffffffff)) != 0) {
      if (local_8 == (char *)0x0) {
        asprintf((char **)&stack0xffffffffffffffd0,"%s%#lx%s",
                 *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x20),
                 (ulong)in_RDX & (local_68 ^ 0xffffffffffffffff),
                 *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x28));
      }
      else {
        asprintf(&local_60,"%s | %s%#lx%s",local_8,*(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x20),
                 (ulong)in_RDX & (local_68 ^ 0xffffffffffffffff),
                 *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x28));
        free(local_8);
        local_8 = local_60;
      }
    }
    if (local_8 == (char *)0x0) {
      asprintf((char **)&stack0xffffffffffffffd0,"%s0%s",
               *(undefined8 *)(*(long *)(in_RDI + 0x18) + 8),
               *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x28));
    }
    asprintf(&local_60,"{ %s }",local_8);
    free(local_8);
    local_8 = local_60;
    break;
  case (rnndeccontext *)0x4:
    local_8 = rnndec_decodeval(in_RSI,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),0);
    break;
  case (rnndeccontext *)0x5:
    asprintf((char **)&stack0xffffffffffffffd0,"%s%#lx%s",
             *(undefined8 *)(*(long *)(in_RDI + 0x18) + 8),in_RDX,
             *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x28));
    break;
  case (rnndeccontext *)0x6:
    if (((ulong)in_RDX & 1L << ((byte)in_ECX - 1 & 0x3f)) == 0) {
      asprintf((char **)&stack0xffffffffffffffd0,"%s%li%s",
               *(undefined8 *)(*(long *)(in_RDI + 0x18) + 8),in_RDX,
               *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x28));
    }
    else {
      asprintf((char **)&stack0xffffffffffffffd0,"%s-%li%s",
               *(undefined8 *)(*(long *)(in_RDI + 0x18) + 8),
               (1L << ((byte)in_ECX & 0x3f)) - (long)in_RDX,
               *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x28));
    }
    break;
  case (rnndeccontext *)0x7:
    asprintf((char **)&stack0xffffffffffffffd0,"%s%lu%s",
             *(undefined8 *)(*(long *)(in_RDI + 0x18) + 8),in_RDX,
             *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x28));
    break;
  case (rnndeccontext *)0x9:
    if (in_RDX == (rnntypeinfo *)0x0) {
      asprintf((char **)&stack0xffffffffffffffd0,"%sFALSE%s",
               *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x18),
               *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x28));
      return local_8;
    }
    if (in_RDX == (rnntypeinfo *)0x1) {
      asprintf((char **)&stack0xffffffffffffffd0,"%sTRUE%s",
               *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x18),
               *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x28));
      return local_8;
    }
  case (rnndeccontext *)0x8:
    if (in_ECX == 0x40) {
      asprintf((char **)&stack0xffffffffffffffd0,"%s%f%s",in_RDX,
               *(undefined8 *)(*(long *)(in_RDI + 0x18) + 8),
               *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x28));
      return local_8;
    }
    if (in_ECX == 0x20) {
      local_80 = SUB84(in_RDX,0);
      asprintf((char **)&stack0xffffffffffffffd0,"%s%f%s",(double)local_80,
               *(undefined8 *)(*(long *)(in_RDI + 0x18) + 8),
               *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x28));
      return local_8;
    }
    goto switchD_0010ad3e_default;
  }
  return local_8;
}

Assistant:

char *rnndec_decodeval(struct rnndeccontext *ctx, struct rnntypeinfo *ti, uint64_t value, int width) {
	char *res = 0;
	int i;
	struct rnnvalue **vals;
	int valsnum;
	struct rnnbitfield **bitfields;
	int bitfieldsnum;
	char *tmp;
	uint64_t mask;
	if (!ti)
		goto failhex;
	if (ti->shr) value <<= ti->shr;
	switch (ti->type) {
		case RNN_TTYPE_ENUM:
			vals = ti->eenum->vals;
			valsnum = ti->eenum->valsnum;
			goto doenum;
		case RNN_TTYPE_INLINE_ENUM:
			vals = ti->vals;
			valsnum = ti->valsnum;
			goto doenum;
		doenum:
			for (i = 0; i < valsnum; i++)
				if (rnndec_varmatch(ctx, &vals[i]->varinfo) && vals[i]->valvalid && vals[i]->value == value) {
					asprintf (&res, "%s%s%s", ctx->colors->ceval, vals[i]->name, ctx->colors->cend);
					return res;
				}
			goto failhex;
		case RNN_TTYPE_BITSET:
			bitfields = ti->ebitset->bitfields;
			bitfieldsnum = ti->ebitset->bitfieldsnum;
			goto dobitset;
		case RNN_TTYPE_INLINE_BITSET:
			bitfields = ti->bitfields;
			bitfieldsnum = ti->bitfieldsnum;
			goto dobitset;
		dobitset:
			mask = 0;
			for (i = 0; i < bitfieldsnum; i++) {
				if (!rnndec_varmatch(ctx, &bitfields[i]->varinfo))
					continue;
				uint64_t sval = (value & bitfields[i]->mask) >> bitfields[i]->low;
				mask |= bitfields[i]->mask;
				if (bitfields[i]->typeinfo.type == RNN_TTYPE_BOOLEAN) {
					if (sval == 0)
						continue;
					else if (sval == 1) {
						if (!res)
							asprintf (&res, "%s%s%s", ctx->colors->cbool, bitfields[i]->name, ctx->colors->cend);
						else {
							asprintf (&tmp, "%s | %s%s%s", res, ctx->colors->cbool, bitfields[i]->name, ctx->colors->cend);
							free(res);
							res = tmp;
						}
						continue;
					}
				}
				char *subval = rnndec_decodeval(ctx, &bitfields[i]->typeinfo, sval, bitfields[i]->high - bitfields[i]->low + 1);
				if (!res)
					asprintf (&res, "%s%s%s = %s", ctx->colors->cname, bitfields[i]->name, ctx->colors->cend, subval);
				else {
					asprintf (&tmp, "%s | %s%s%s = %s", res, ctx->colors->cname, bitfields[i]->name, ctx->colors->cend, subval);
					free(res);
					res = tmp;
				}
				free(subval);
			}
			if (value & ~mask) {
				if (!res)
					asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->cerr, value & ~mask, ctx->colors->cend);
				else {
					asprintf (&tmp, "%s | %s%#"PRIx64"%s", res, ctx->colors->cerr, value & ~mask, ctx->colors->cend);
					free(res);
					res = tmp;
				}
			}
			if (!res)
				asprintf (&res, "%s0%s", ctx->colors->cimm, ctx->colors->cend);
			asprintf (&tmp, "{ %s }", res);
			free(res);
			return tmp;
		case RNN_TTYPE_SPECTYPE:
			return rnndec_decodeval(ctx, &ti->spectype->typeinfo, value, width);
		case RNN_TTYPE_HEX:
			asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->cimm, value, ctx->colors->cend);
			return res;
		case RNN_TTYPE_UINT:
			asprintf (&res, "%s%"PRIu64"%s", ctx->colors->cimm, value, ctx->colors->cend);
			return res;
		case RNN_TTYPE_INT:
			if (value & UINT64_C(1) << (width-1))
				asprintf (&res, "%s-%"PRIi64"%s", ctx->colors->cimm, (UINT64_C(1) << width) - value, ctx->colors->cend);
			else
				asprintf (&res, "%s%"PRIi64"%s", ctx->colors->cimm, value, ctx->colors->cend);
			return res;
		case RNN_TTYPE_BOOLEAN:
			if (value == 0) {
				asprintf (&res, "%sFALSE%s", ctx->colors->cbool, ctx->colors->cend);
				return res;
			} else if (value == 1) {
				asprintf (&res, "%sTRUE%s", ctx->colors->cbool, ctx->colors->cend);
				return res;
			}
		case RNN_TTYPE_FLOAT: {
			union { uint64_t i; float f; double d; } val;
			val.i = value;
			if (width == 64)
				asprintf(&res, "%s%f%s", ctx->colors->cimm,
					val.d, ctx->colors->cend);
			else if (width == 32)
				asprintf(&res, "%s%f%s", ctx->colors->cimm,
					val.f, ctx->colors->cend);
			else
				goto failhex;

			return res;
		}
		failhex:
		default:
			asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->cerr, value, ctx->colors->cend);
			return res;
			break;
	}
}